

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O0

void test_common<unsigned_int>(uint length,uint value)

{
  int iVar1;
  uint *puVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  uint local_8dc;
  uint local_8d8;
  uint i_7;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_1;
  uint *b;
  uint *a;
  undefined1 local_8a8 [8];
  shared_ptr<unsigned_int> pb;
  shared_ptr<unsigned_int> pa;
  uint value_local;
  uint length_local;
  int local_83c;
  undefined8 uStack_838;
  int i;
  undefined8 uStack_830;
  uint local_824;
  element_type *local_820;
  uint local_818;
  int local_814;
  element_type *local_810;
  undefined1 *local_808;
  uint local_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  element_type *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  element_type *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  element_type *local_730;
  undefined8 local_728;
  undefined8 uStack_720;
  element_type *local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  element_type *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  element_type *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  element_type *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  element_type *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  element_type *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  element_type *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  element_type *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  element_type *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  element_type *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  element_type *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  int local_5a0;
  uint local_59c;
  int i_2;
  element_type *local_590;
  int local_588;
  uint local_584;
  int i_6;
  element_type *local_578;
  int local_56c;
  element_type *local_568;
  element_type *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  element_type *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  element_type *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  element_type *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  element_type *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  element_type *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  element_type *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  element_type *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  element_type *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  element_type *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  element_type *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  element_type *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  element_type *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  element_type *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  element_type *local_338;
  int local_32c;
  element_type *local_328;
  element_type *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  element_type *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  element_type *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  element_type *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  element_type *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  element_type *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  element_type *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  element_type *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  element_type *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  element_type *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  element_type *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  element_type *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  element_type *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  element_type *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  element_type *local_f0;
  element_type *local_e8;
  element_type *local_e0;
  element_type *local_d8;
  element_type *local_d0;
  element_type *local_c8;
  element_type *local_c0;
  element_type *local_b8;
  element_type *local_b0;
  element_type *local_a8;
  element_type *local_a0;
  element_type *local_98;
  element_type *local_90;
  element_type *local_88;
  element_type *local_80;
  element_type *local_78;
  element_type *local_70;
  element_type *local_68;
  element_type *local_60;
  element_type *local_58;
  element_type *local_50;
  element_type *local_48;
  element_type *local_40;
  element_type *local_38;
  element_type *local_30;
  element_type *local_28;
  element_type *local_20;
  element_type *local_18;
  element_type *local_10;
  
  puVar2 = nosimd::common::malloc<unsigned_int>(length + 1);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((shared_ptr<unsigned_int> *)
             &pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar2,
             nosimd::common::free<unsigned_int>);
  puVar2 = nosimd::common::malloc<unsigned_int>(length + 1);
  std::shared_ptr<unsigned_int>::shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((shared_ptr<unsigned_int> *)local_8a8,puVar2,nosimd::common::free<unsigned_int>);
  peVar3 = std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)
                      &pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _i_6 = std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)local_8a8);
  peVar3[length] = 0x7f;
  _i_6[length] = 0x3f;
  uStack_838 = CONCAT44(value,value);
  uStack_830 = CONCAT44(value,value);
  local_808 = (undefined1 *)&stack0xfffffffffffff7c8;
  iVar1 = (int)length >> 2;
  local_810 = peVar3;
  for (local_814 = iVar1; 3 < local_814; local_814 = local_814 + -4) {
    local_6b0 = local_810;
    local_690 = local_810;
    *(undefined8 *)local_810 = uStack_838;
    *(undefined8 *)(local_810 + 2) = uStack_830;
    local_6d0 = local_810 + 4;
    *(undefined8 *)local_6d0 = uStack_838;
    *(undefined8 *)(local_810 + 6) = uStack_830;
    local_6f0 = local_810 + 8;
    *(undefined8 *)local_6f0 = uStack_838;
    *(undefined8 *)(local_810 + 10) = uStack_830;
    local_710 = local_810 + 0xc;
    *(undefined8 *)local_710 = uStack_838;
    *(undefined8 *)(local_810 + 0xe) = uStack_830;
    local_810 = local_810 + 0x10;
    local_7f8 = uStack_838;
    uStack_7f0 = uStack_830;
    local_7e8 = uStack_838;
    uStack_7e0 = uStack_830;
    local_7d8 = uStack_838;
    uStack_7d0 = uStack_830;
    local_7c8 = uStack_838;
    uStack_7c0 = uStack_830;
    local_728 = uStack_838;
    uStack_720 = uStack_830;
    local_708 = uStack_838;
    uStack_700 = uStack_830;
    local_6e8 = uStack_838;
    uStack_6e0 = uStack_830;
    local_6c8 = uStack_838;
    uStack_6c0 = uStack_830;
    local_6a8 = uStack_838;
    uStack_6a0 = uStack_830;
    local_688 = uStack_838;
    uStack_680 = uStack_830;
    local_670 = local_6d0;
    local_668 = uStack_838;
    uStack_660 = uStack_830;
    local_650 = local_6f0;
    local_648 = uStack_838;
    uStack_640 = uStack_830;
    local_630 = local_710;
  }
  if (1 < local_814) {
    local_730 = local_810;
    local_610 = local_810;
    *(undefined8 *)local_810 = uStack_838;
    *(undefined8 *)(local_810 + 2) = uStack_830;
    local_750 = local_810 + 4;
    *(undefined8 *)local_750 = uStack_838;
    *(undefined8 *)(local_810 + 6) = uStack_830;
    local_814 = local_814 + -2;
    local_810 = local_810 + 8;
    local_7b8 = uStack_838;
    uStack_7b0 = uStack_830;
    local_7a8 = uStack_838;
    uStack_7a0 = uStack_830;
    local_768 = uStack_838;
    uStack_760 = uStack_830;
    local_748 = uStack_838;
    uStack_740 = uStack_830;
    local_628 = uStack_838;
    uStack_620 = uStack_830;
    local_608 = uStack_838;
    uStack_600 = uStack_830;
    local_5f0 = local_750;
  }
  if (local_814 != 0) {
    local_770 = local_810;
    local_5d0 = local_810;
    *(undefined8 *)local_810 = uStack_838;
    *(undefined8 *)(local_810 + 2) = uStack_830;
    local_798 = uStack_838;
    uStack_790 = uStack_830;
    local_788 = uStack_838;
    uStack_780 = uStack_830;
    local_5e8 = uStack_838;
    uStack_5e0 = uStack_830;
  }
  for (local_83c = length - (length & 3); local_83c < (int)length; local_83c = local_83c + 1) {
    peVar3[local_83c] = value;
  }
  for (i_4 = 0; local_32c = iVar1, local_328 = _i_6, local_320 = peVar3, local_824 = length,
      local_820 = peVar3, local_818 = value, local_7fc = value, local_5c8 = uStack_838,
      uStack_5c0 = uStack_830, local_5b0 = value, local_5ac = value, local_5a8 = value,
      local_5a4 = value, i_4 < length; i_4 = i_4 + 1) {
    if (peVar3[i_4] != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = unsigned int]";
      *(undefined4 *)(puVar4 + 1) = 0x16;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (; 3 < local_32c; local_32c = local_32c + -4) {
    local_b8 = local_320;
    local_40 = local_320;
    local_2b8 = *(undefined8 *)local_320;
    uStack_2b0 = *(undefined8 *)(local_320 + 2);
    local_1d0 = local_328;
    local_1b0 = local_328;
    *(undefined8 *)local_328 = local_2b8;
    *(undefined8 *)(local_328 + 2) = uStack_2b0;
    local_1f0 = local_328 + 4;
    local_c0 = local_320 + 4;
    local_2c8 = *(undefined8 *)local_c0;
    uStack_2c0 = *(undefined8 *)(local_320 + 6);
    *(undefined8 *)local_1f0 = local_2c8;
    *(undefined8 *)(local_328 + 6) = uStack_2c0;
    local_210 = local_328 + 8;
    local_c8 = local_320 + 8;
    local_2d8 = *(undefined8 *)local_c8;
    uStack_2d0 = *(undefined8 *)(local_320 + 10);
    *(undefined8 *)local_210 = local_2d8;
    *(undefined8 *)(local_328 + 10) = uStack_2d0;
    local_230 = local_328 + 0xc;
    local_d0 = local_320 + 0xc;
    local_2e8 = *(undefined8 *)local_d0;
    uStack_2e0 = *(undefined8 *)(local_320 + 0xe);
    *(undefined8 *)local_230 = local_2e8;
    *(undefined8 *)(local_328 + 0xe) = uStack_2e0;
    local_328 = local_328 + 0x10;
    local_320 = local_320 + 0x10;
    local_248 = local_2e8;
    uStack_240 = uStack_2e0;
    local_228 = local_2d8;
    uStack_220 = uStack_2d0;
    local_208 = local_2c8;
    uStack_200 = uStack_2c0;
    local_1e8 = local_2b8;
    uStack_1e0 = uStack_2b0;
    local_1c8 = local_2b8;
    uStack_1c0 = uStack_2b0;
    local_1a8 = local_2c8;
    uStack_1a0 = uStack_2c0;
    local_190 = local_1f0;
    local_188 = local_2d8;
    uStack_180 = uStack_2d0;
    local_170 = local_210;
    local_168 = local_2e8;
    uStack_160 = uStack_2e0;
    local_150 = local_230;
    local_38 = local_c0;
    local_30 = local_c8;
    local_28 = local_d0;
  }
  if (1 < local_32c) {
    local_d8 = local_320;
    local_20 = local_320;
    local_2f8 = *(undefined8 *)local_320;
    uStack_2f0 = *(undefined8 *)(local_320 + 2);
    local_250 = local_328;
    local_130 = local_328;
    *(undefined8 *)local_328 = local_2f8;
    *(undefined8 *)(local_328 + 2) = uStack_2f0;
    local_270 = local_328 + 4;
    local_e0 = local_320 + 4;
    local_308 = *(undefined8 *)local_e0;
    uStack_300 = *(undefined8 *)(local_320 + 6);
    *(undefined8 *)local_270 = local_308;
    *(undefined8 *)(local_328 + 6) = uStack_300;
    local_32c = local_32c + -2;
    local_320 = local_320 + 8;
    local_328 = local_328 + 8;
    local_288 = local_308;
    uStack_280 = uStack_300;
    local_268 = local_2f8;
    uStack_260 = uStack_2f0;
    local_148 = local_2f8;
    uStack_140 = uStack_2f0;
    local_128 = local_308;
    uStack_120 = uStack_300;
    local_110 = local_270;
    local_18 = local_e0;
  }
  if (local_32c != 0) {
    local_e8 = local_320;
    local_10 = local_320;
    local_318 = *(undefined8 *)local_320;
    uStack_310 = *(undefined8 *)(local_320 + 2);
    local_290 = local_328;
    local_f0 = local_328;
    *(undefined8 *)local_328 = local_318;
    *(undefined8 *)(local_328 + 2) = uStack_310;
    local_2a8 = local_318;
    uStack_2a0 = uStack_310;
    local_108 = local_318;
    uStack_100 = uStack_310;
  }
  for (local_5a0 = length - (length & 3); local_5a0 < (int)length; local_5a0 = local_5a0 + 1) {
    _i_6[local_5a0] = peVar3[local_5a0];
  }
  for (i_5 = 0; local_59c = length, _i_2 = _i_6, local_590 = peVar3, i_5 < length; i_5 = i_5 + 1) {
    if (_i_6[i_5] != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = unsigned int]";
      *(undefined4 *)(puVar4 + 1) = 0x1d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<unsigned_int>(_i_6,length);
  for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
    if (_i_6[i_7] != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = unsigned int]";
      *(undefined4 *)(puVar4 + 1) = 0x24;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (local_8d8 = 0; local_56c = iVar1, local_568 = _i_6, local_560 = peVar3, local_8d8 < length;
      local_8d8 = local_8d8 + 1) {
    peVar3[local_8d8] = local_8d8;
  }
  for (; 3 < local_56c; local_56c = local_56c + -4) {
    local_80 = local_560;
    local_78 = local_560;
    local_4f8 = *(undefined8 *)local_560;
    uStack_4f0 = *(undefined8 *)(local_560 + 2);
    local_410 = local_568;
    local_3f0 = local_568;
    *(undefined8 *)local_568 = local_4f8;
    *(undefined8 *)(local_568 + 2) = uStack_4f0;
    local_430 = local_568 + 4;
    local_88 = local_560 + 4;
    local_508 = *(undefined8 *)local_88;
    uStack_500 = *(undefined8 *)(local_560 + 6);
    *(undefined8 *)local_430 = local_508;
    *(undefined8 *)(local_568 + 6) = uStack_500;
    local_450 = local_568 + 8;
    local_90 = local_560 + 8;
    local_518 = *(undefined8 *)local_90;
    uStack_510 = *(undefined8 *)(local_560 + 10);
    *(undefined8 *)local_450 = local_518;
    *(undefined8 *)(local_568 + 10) = uStack_510;
    local_470 = local_568 + 0xc;
    local_98 = local_560 + 0xc;
    local_528 = *(undefined8 *)local_98;
    uStack_520 = *(undefined8 *)(local_560 + 0xe);
    *(undefined8 *)local_470 = local_528;
    *(undefined8 *)(local_568 + 0xe) = uStack_520;
    local_568 = local_568 + 0x10;
    local_560 = local_560 + 0x10;
    local_488 = local_528;
    uStack_480 = uStack_520;
    local_468 = local_518;
    uStack_460 = uStack_510;
    local_448 = local_508;
    uStack_440 = uStack_500;
    local_428 = local_4f8;
    uStack_420 = uStack_4f0;
    local_408 = local_4f8;
    uStack_400 = uStack_4f0;
    local_3e8 = local_508;
    uStack_3e0 = uStack_500;
    local_3d0 = local_430;
    local_3c8 = local_518;
    uStack_3c0 = uStack_510;
    local_3b0 = local_450;
    local_3a8 = local_528;
    uStack_3a0 = uStack_520;
    local_390 = local_470;
    local_70 = local_88;
    local_68 = local_90;
    local_60 = local_98;
  }
  if (1 < local_56c) {
    local_a0 = local_560;
    local_58 = local_560;
    local_538 = *(undefined8 *)local_560;
    uStack_530 = *(undefined8 *)(local_560 + 2);
    local_490 = local_568;
    local_370 = local_568;
    *(undefined8 *)local_568 = local_538;
    *(undefined8 *)(local_568 + 2) = uStack_530;
    local_4b0 = local_568 + 4;
    local_a8 = local_560 + 4;
    local_548 = *(undefined8 *)local_a8;
    uStack_540 = *(undefined8 *)(local_560 + 6);
    *(undefined8 *)local_4b0 = local_548;
    *(undefined8 *)(local_568 + 6) = uStack_540;
    local_56c = local_56c + -2;
    local_560 = local_560 + 8;
    local_568 = local_568 + 8;
    local_4c8 = local_548;
    uStack_4c0 = uStack_540;
    local_4a8 = local_538;
    uStack_4a0 = uStack_530;
    local_388 = local_538;
    uStack_380 = uStack_530;
    local_368 = local_548;
    uStack_360 = uStack_540;
    local_350 = local_4b0;
    local_50 = local_a8;
  }
  if (local_56c != 0) {
    local_b0 = local_560;
    local_48 = local_560;
    local_558 = *(undefined8 *)local_560;
    uStack_550 = *(undefined8 *)(local_560 + 2);
    local_4d0 = local_568;
    local_338 = local_568;
    *(undefined8 *)local_568 = local_558;
    *(undefined8 *)(local_568 + 2) = uStack_550;
    local_4e8 = local_558;
    uStack_4e0 = uStack_550;
    local_348 = local_558;
    uStack_340 = uStack_550;
  }
  for (local_588 = length - (length & 3); local_588 < (int)length; local_588 = local_588 + 1) {
    _i_6[local_588] = peVar3[local_588];
  }
  for (local_8dc = 0; local_584 = length, local_578 = peVar3, local_8dc < length;
      local_8dc = local_8dc + 1) {
    if (_i_6[local_8dc] != local_8dc) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = unsigned int]";
      *(undefined4 *)(puVar4 + 1) = 0x2d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((peVar3[length] == 0x7f) && (_i_6[length] == 0x3f)) {
    std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)local_8a8);
    std::shared_ptr<unsigned_int>::~shared_ptr
              ((shared_ptr<unsigned_int> *)
               &pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = unsigned int]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}